

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::FragmentDataLocationAPITest::getProgramInterface
          (FragmentDataLocationAPITest *this,GLuint param_1,ProgramInterface *program_interface,
          VaryingPassthrough *param_3)

{
  ShaderInterface *this_00;
  
  this->m_goku_location = 2;
  this_00 = &program_interface->m_fragment;
  std::__cxx11::string::_M_replace
            ((ulong)this_00,0,(char *)(program_interface->m_fragment).m_globals._M_string_length,
             0x1a5001b);
  Utils::ShaderInterface::Output<void>
            (this_00,"goku","layout (location = GOKU_LOCATION)",0,this->m_goku_location,
             (Type *)&Utils::Type::vec4,'\0',0,0,0,(void *)0x0,0);
  Utils::ShaderInterface::Output<void>
            (this_00,"gohan",glcts::fixed_sample_locations_values + 1,0,-1,
             (Type *)&Utils::Type::vec4,'\0',0,0,0,(void *)0x0,0);
  Utils::ShaderInterface::Output<void>
            (this_00,"goten",glcts::fixed_sample_locations_values + 1,0,6,(Type *)&Utils::Type::vec4
             ,'\0',0,0,0,(void *)0x0,0);
  Utils::ShaderInterface::Output<void>
            (this_00,"chichi",glcts::fixed_sample_locations_values + 1,0,-1,
             (Type *)&Utils::Type::vec4,'\0',0,0,0,(void *)0x0,0);
  return;
}

Assistant:

void FragmentDataLocationAPITest::getProgramInterface(GLuint /* test_case_index */,
													  Utils::ProgramInterface& program_interface,
													  Utils::VaryingPassthrough& /* varying_passthrough */)
{
	Utils::ShaderInterface& si   = program_interface.GetShaderInterface(Utils::Shader::FRAGMENT);
	const Utils::Type&		type = Utils::Type::vec4;

	/* Locations */
	m_goku_location = 2;

	/* Globals */
	si.m_globals = "const uint GOKU_LOCATION = 2;\n";

	/* Attributes */
	si.Output("goku" /* name */, "layout (location = GOKU_LOCATION)" /* qualifiers */, 0 /* expected_componenet */,
			  m_goku_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			  0u /* n_array_elements */, 0u /* stride */, 0u /* offset */, (GLvoid*)0 /* data */, 0u /* data_size */);

	si.Output("gohan" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			  Utils::Variable::m_automatic_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			  0u /* n_array_elements */, 0u /* stride */, 0u /* offset */, (GLvoid*)0 /* data */, 0u /* data_size */);

	si.Output("goten" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			  m_goten_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			  0u /* n_array_elements */, 0u /* stride */, 0u /* offset */, (GLvoid*)0 /* data */, 0u /* data_size */);

	si.Output("chichi" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			  Utils::Variable::m_automatic_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			  0u /* n_array_elements */, 0u /* stride */, 0u /* offset */, (GLvoid*)0 /* data */, 0u /* data_size */);
}